

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_let_statement(Parser *this)

{
  VM_Writer *this_00;
  bool bVar1;
  int index;
  ostream *poVar2;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  string segment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string identifier;
  Parser *this_local;
  
  identifier.field_2._8_8_ = this;
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t<let_statement>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)local_30,(string *)&this->cur_token);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"IDENTIFIER",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"let statement",&local_89);
  check_token_type_x_after_y(this,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_d0,"\t\t\t\t<identifier>",&this->cur_token);
  std::operator+(&local_b0,&local_d0,"</identifier>");
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  query_tokenizer(this);
  Tokenizer::get_current_token_abi_cxx11_(&local_f0,this->tokenizer);
  bVar1 = std::operator==(&local_f0,"[");
  std::__cxx11::string::~string((string *)&local_f0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<symbol>[</symbol>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"INT_CONST",&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"symbol",&local_139);
    check_token_type_x_after_y(this,&local_110,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_180,"\t\t\t\t<int>",&this->cur_token);
    std::operator+(&local_160,&local_180,"</int>");
    poVar2 = std::operator<<(poVar2,(string *)&local_160);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"]",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"integer",&local_1c9);
    check_expected_x_after_y(this,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_210,"\t\t\t\t<symbol>",&this->cur_token);
    std::operator+(&local_1f0,&local_210,"</symbol>");
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"=",&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"]",&local_259);
    check_expected_x_after_y(this,&local_230,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"=",&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"identifier",&local_2a9)
    ;
    check_expected_x_after_y(this,&local_280,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<symbol>=</symbol>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  parse_expression(this);
  poVar2 = (ostream *)this->out_file;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&segment.field_2 + 8),"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&segment.field_2 + 8),"</symbol>");
  poVar2 = std::operator<<(poVar2,(string *)&local_2d0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)(segment.field_2._M_local_buf + 8));
  get_segment((string *)local_310,this,(string *)local_30);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_310,"none");
  if (!bVar1) {
    this_00 = this->vm_writer;
    get_segment(&local_370,this,(string *)local_30);
    index = Symbol_Table::get_index(&this->symbol_table,(string *)local_30);
    VM_Writer::write_pop(this_00,&local_370,index);
    std::__cxx11::string::~string((string *)&local_370);
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t</let_statement>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    query_tokenizer(this);
    std::__cxx11::string::~string((string *)local_310);
    std::__cxx11::string::~string((string *)local_30);
    return;
  }
  std::operator+(&local_350,"Identifier \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_330,&local_350,"\' was not declared");
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_330);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  exit(0);
}

Assistant:

void Parser::parse_let_statement() {
    out_file << "\t\t\t<let_statement>" << std::endl;
    std::string identifier = cur_token;
    check_token_type_x_after_y("IDENTIFIER", "let statement");
    out_file << "\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
    query_tokenizer();

    if (tokenizer.get_current_token() == "[") {
        out_file << "\t\t\t\t<symbol>[</symbol>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("INT_CONST", "symbol");
        out_file << "\t\t\t\t<int>" + cur_token + "</int>" << std::endl;
        query_tokenizer();

        check_expected_x_after_y("]", "integer");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();
        check_expected_x_after_y("=", "]");
    }
    else {
        check_expected_x_after_y("=", "identifier");
    }

    out_file << "\t\t\t\t<symbol>=</symbol>" << std::endl;
    query_tokenizer();

    parse_expression();

    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    std::string segment = get_segment(identifier);
    if (segment == "none") {
        std::cerr << "Identifier '" + identifier  + "' was not declared" << std::endl;
        exit(0);
    }
    vm_writer.write_pop(get_segment(identifier), symbol_table.get_index(identifier));
    out_file << "\t\t\t</let_statement>" << std::endl;
    query_tokenizer();
}